

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::percolateDown
          (Heap<Glucose::SimpSolver::ElimLt> *this,int i)

{
  int iVar1;
  int iVar2;
  vec<int> *pvVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  
  pvVar3 = (this->lt).n_occ;
  piVar4 = (this->heap).data;
  iVar1 = piVar4[i];
  piVar5 = (this->indices).data;
  while( true ) {
    iVar7 = i * 2 + 1;
    iVar2 = (this->heap).sz;
    if (iVar2 <= iVar7) break;
    iVar8 = i * 2 + 2;
    if ((iVar2 <= iVar8) ||
       (piVar6 = pvVar3->data,
       (ulong)((long)piVar6[piVar4[iVar7] * 2 + 1] * (long)piVar6[(long)piVar4[iVar7] * 2]) <=
       (ulong)((long)piVar6[piVar4[iVar8] * 2 + 1] * (long)piVar6[(long)piVar4[iVar8] * 2]))) {
      iVar8 = iVar7;
    }
    iVar2 = piVar4[iVar8];
    piVar6 = pvVar3->data;
    if ((ulong)((long)piVar6[iVar1 * 2 + 1] * (long)piVar6[(long)iVar1 * 2]) <=
        (ulong)((long)piVar6[iVar2 * 2 + 1] * (long)piVar6[(long)iVar2 * 2])) break;
    piVar4[i] = iVar2;
    piVar5[iVar2] = i;
    i = iVar8;
  }
  piVar4[i] = iVar1;
  (this->indices).data[iVar1] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }